

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O2

void trico_compress(uint32_t *nr_of_compressed_bytes,uint8_t **out,float *input,
                   uint32_t number_of_floats,uint32_t hash1_size_exponent,
                   uint32_t hash2_size_exponent)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  uint8_t **ppuVar4;
  float fVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint8_t *local_f0;
  int local_e8;
  int local_e4;
  uint local_e0;
  uint local_dc;
  void *local_d8;
  void *local_d0;
  uint32_t *local_c8;
  uint8_t **local_c0;
  ulong local_b8;
  long local_b0;
  float *local_a8;
  ulong local_a0;
  uint32_t bcode [8];
  uint32_t xor1 [8];
  uint32_t xor2 [8];
  
  uVar14 = (ulong)(hash1_size_exponent & 0xfffffffe);
  if (0x1d < (hash1_size_exponent & 0xfffffffe)) {
    uVar14 = 0x1e;
  }
  uVar10 = (ulong)(hash2_size_exponent & 0xfffffffe);
  if (0x1d < (hash2_size_exponent & 0xfffffffe)) {
    uVar10 = 0x1e;
  }
  local_c8 = nr_of_compressed_bytes;
  local_a8 = input;
  puVar6 = (uint8_t *)
           malloc((ulong)((number_of_floats & 7) + number_of_floats * 4 +
                         (number_of_floats * 3 + 0x15 >> 3)));
  uVar12 = 1 << ((byte)uVar14 & 0x1f);
  uVar15 = 1 << ((byte)uVar10 & 0x1f);
  *out = puVar6;
  local_dc = uVar12 - 1;
  local_e0 = uVar15 - 1;
  local_c0 = out;
  local_d0 = calloc((ulong)uVar12,4);
  local_d8 = calloc((ulong)uVar15,4);
  bVar3 = (byte)(uVar10 >> 1);
  *puVar6 = bVar3 + (byte)uVar14 * '\b';
  puVar6[1] = (uint8_t)(number_of_floats >> 0x18);
  puVar6[2] = (uint8_t)(number_of_floats >> 0x10);
  puVar6[3] = (uint8_t)(number_of_floats >> 8);
  local_f0 = puVar6 + 5;
  puVar6[4] = (uint8_t)number_of_floats;
  local_e8 = 0x20 - (int)uVar14;
  local_e4 = 0x20 - (int)uVar10;
  uVar10 = (ulong)number_of_floats;
  lVar16 = 0;
  uVar13 = 0;
  uVar9 = 0;
  iVar18 = 0;
  uVar7 = 0;
  fVar5 = 0.0;
  fVar11 = 0.0;
  local_b8 = uVar10;
  local_a0 = uVar14;
  do {
    if ((uint)uVar10 == (uint)lVar16) {
      iVar18 = (int)uVar7;
      while (uVar7 = uVar7 + 1, uVar7 != 8) {
        bcode[uVar7] = 1;
        xor1[uVar7] = 0;
      }
      if (iVar18 != 7) {
        trico_fill_code(&local_f0,xor1,xor2,bcode);
      }
      ppuVar4 = local_c0;
      puVar6 = *local_c0;
      uVar12 = (int)local_f0 - (int)puVar6;
      *local_c8 = uVar12;
      free(local_d0);
      free(local_d8);
      puVar6 = (uint8_t *)realloc(puVar6,(ulong)uVar12);
      *ppuVar4 = puVar6;
      return;
    }
    uVar17 = (uint)lVar16 & 7;
    uVar7 = (ulong)uVar17;
    fVar1 = local_a8[lVar16];
    uVar12 = (uint)fVar1 ^ (uint)fVar5;
    uVar14 = (ulong)(uVar17 * 4);
    *(float *)((long)local_d0 + uVar13 * 4) = fVar1;
    *(uint *)((long)xor1 + uVar14) = uVar12;
    uVar13 = (ulong)(((uint)fVar1 >> ((byte)local_e8 & 0x1f) ^
                     (int)uVar13 << ((byte)local_a0 & 0x1f)) & local_dc);
    *(int *)((long)local_d8 + uVar9 * 4) = (int)fVar1 - (int)fVar11;
    fVar2 = *(float *)((long)local_d0 + uVar13 * 4);
    uVar15 = iVar18 + (int)fVar11 ^ (uint)fVar1;
    *(uint *)((long)xor2 + uVar14) = uVar15;
    uVar9 = (ulong)(((uint)((int)fVar1 - (int)fVar11) >> ((byte)local_e4 & 0x1f) ^
                    (int)uVar9 << (bVar3 & 0x1f)) & local_e0);
    iVar18 = *(int *)((long)local_d8 + uVar9 * 4);
    *(undefined4 *)((long)bcode + uVar14) = 4;
    uVar8 = 0;
    if ((fVar1 == fVar5) || (uVar8 = 1, uVar12 < 0x100)) {
LAB_00106878:
      bcode[uVar7] = uVar8;
    }
    else {
      if (uVar12 < 0x10000) {
        uVar8 = (uint)(uVar15 < 0x100) * 3 + 2;
        goto LAB_00106878;
      }
      if (uVar12 < 0x1000000) {
        bcode[uVar7] = 3;
        uVar8 = 5;
        if ((uVar15 < 0x100) || (uVar8 = 6, uVar15 < 0x10000)) goto LAB_00106878;
      }
      else {
        uVar8 = 5;
        if (((uVar15 < 0x100) || (uVar8 = 6, uVar15 < 0x10000)) || (uVar8 = 7, uVar15 < 0x1000000))
        goto LAB_00106878;
      }
    }
    if (uVar17 == 7) {
      local_b0 = lVar16;
      trico_fill_code(&local_f0,xor1,xor2,bcode);
      uVar10 = local_b8;
      lVar16 = local_b0;
    }
    lVar16 = lVar16 + 1;
    fVar5 = fVar2;
    fVar11 = fVar1;
  } while( true );
}

Assistant:

void trico_compress(uint32_t* nr_of_compressed_bytes, uint8_t** out, const float* input, const uint32_t number_of_floats, uint32_t hash1_size_exponent, uint32_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_floats) * sizeof(float) + 3 * (number_of_floats + 7) / 8 + (number_of_floats & 7); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);


  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  uint32_t value;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t hash1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction1 = 0;
  uint32_t prediction2 = 0;
  uint32_t xor1[8];
  uint32_t xor2[8];
  uint32_t bcode[8];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_floats >> 24));
  *p_out++ = (uint8_t)((number_of_floats >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats) & 0xff);

  for (uint32_t i = 0; i < number_of_floats; ++i)
    {
    j = i & 7;
    value = *(const uint32_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 4; // 4 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      }
    else // 4 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 7; // 3 bytes
        }
      }

    if (j == 7)
      {
      trico_fill_code(&p_out, xor1, xor2, bcode);
      }
    }
  for (uint32_t l = j + 1; l < 8; ++l)
    {
    bcode[l] = 1;
    xor1[l] = 0;
    }
  if (j != 7)
    {
    trico_fill_code(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }